

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regalloc.cpp
# Opt level: O1

Error __thiscall asmjit::RAPass::formatInlineComment(RAPass *this,StringBuilder *dst,CBNode *node)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  size_t n;
  ulong uVar5;
  uint *puVar6;
  undefined8 *puVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  long lVar12;
  ulong n_00;
  bool bVar13;
  char cVar11;
  
  plVar2 = (long *)node->_passData;
  if (node->_inlineComment != (char *)0x0) {
    StringBuilder::_opString(dst,1,node->_inlineComment,0xffffffffffffffff);
  }
  if ((plVar2 != (long *)0x0) && (*plVar2 != 0)) {
    n = (ulong)this->_annotationLength - dst->_length;
    if (dst->_length <= (ulong)this->_annotationLength && n != 0) {
      StringBuilder::_opChars(dst,1,' ',n);
    }
    n_00 = (ulong)(uint)(this->_contextVd).super_ZoneVectorBase._length;
    lVar12 = dst->_length + 1;
    StringBuilder::_opChar(dst,1,'[');
    StringBuilder::_opChars(dst,1,' ',n_00);
    StringBuilder::_opChar(dst,1,']');
    if (n_00 != 0) {
      lVar3 = *plVar2;
      uVar5 = 0;
      do {
        if ((*(ulong *)(lVar3 + (uVar5 >> 6 & 0x3ffffff) * 8) >> (uVar5 & 0x3f) & 1) != 0) {
          dst->_data[uVar5 + lVar12] = '.';
        }
        uVar5 = uVar5 + 1;
      } while (n_00 != uVar5);
    }
    iVar4 = (int)plVar2[2];
    if (iVar4 != 0) {
      puVar6 = (uint *)((long)plVar2 + (ulong)this->_varMapToVaListOffset + 8);
      do {
        puVar7 = (undefined8 *)(ulong)*(uint *)(*(long *)(puVar6 + -2) + 0x18);
        if (dst->_length <= (ulong)(lVar12 + (long)puVar7)) {
          formatInlineComment();
          *puVar7 = &PTR__HostRuntime_001518c8;
          puVar7[1] = 0;
          puVar7[2] = 0xffffffffffffffff;
          *(undefined2 *)(puVar7 + 3) = 0;
          return 0x1518c8;
        }
        uVar1 = *puVar6;
        bVar13 = (uVar1 & 0x515) == 0;
        cVar8 = bVar13 * '\x03' + 'r';
        cVar9 = bVar13 * '\x03' + 'r';
        if ((uVar1 & 0x22a) != 0) {
          cVar8 = 'u';
          cVar9 = 'u';
        }
        cVar10 = cVar9;
        cVar11 = cVar8;
        if ((uVar1 & 0x515) == 0) {
          cVar11 = 'w';
          cVar10 = 'w';
        }
        bVar13 = (uVar1 & 0x22a) == 0;
        if (bVar13) {
          cVar10 = cVar9;
          cVar11 = cVar8;
        }
        cVar9 = 'x';
        cVar8 = 'x';
        if (bVar13) {
          cVar9 = cVar10;
          cVar8 = cVar11;
        }
        if ((uVar1 & 0x515) == 0) {
          cVar9 = cVar10;
          cVar8 = cVar11;
        }
        cVar8 = cVar8 + -0x20;
        if ((uVar1 >> 0xc & 1) == 0) {
          cVar8 = cVar9;
        }
        *(char *)((long)puVar7 + (long)(dst->_data + lVar12)) = cVar8;
        puVar6 = puVar6 + 6;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
  }
  return 0;
}

Assistant:

Error RAPass::formatInlineComment(StringBuilder& dst, CBNode* node) {
#if !defined(ASMJIT_DISABLE_LOGGING)
  RAData* wd = node->getPassData<RAData>();

  if (node->hasInlineComment())
    dst.appendString(node->getInlineComment());

  if (wd && wd->liveness) {
    if (dst.getLength() < _annotationLength)
      dst.appendChars(' ', _annotationLength - dst.getLength());

    uint32_t vdCount = static_cast<uint32_t>(_contextVd.getLength());
    size_t offset = dst.getLength() + 1;

    dst.appendChar('[');
    dst.appendChars(' ', vdCount);
    dst.appendChar(']');
    RABits* liveness = wd->liveness;

    uint32_t i;
    for (i = 0; i < vdCount; i++) {
      if (liveness->getBit(i))
        dst.getData()[offset + i] = '.';
    }

    uint32_t tiedTotal = wd->tiedTotal;
    TiedReg* tiedArray = reinterpret_cast<TiedReg*>(((uint8_t*)wd) + _varMapToVaListOffset);

    for (i = 0; i < tiedTotal; i++) {
      TiedReg* tied = &tiedArray[i];
      VirtReg* vreg = tied->vreg;
      uint32_t flags = tied->flags;

      char c = 'u';
      if ( (flags & TiedReg::kRAll) && !(flags & TiedReg::kWAll)) c = 'r';
      if (!(flags & TiedReg::kRAll) &&  (flags & TiedReg::kWAll)) c = 'w';
      if ( (flags & TiedReg::kRAll) &&  (flags & TiedReg::kWAll)) c = 'x';
      // Uppercase if unused.
      if ( (flags & TiedReg::kUnuse)) c -= 'a' - 'A';

      ASMJIT_ASSERT(offset + vreg->_raId < dst.getLength());
      dst._data[offset + vreg->_raId] = c;
    }
  }
#endif // !ASMJIT_DISABLE_LOGGING

  return kErrorOk;
}